

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  curl_slist *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  char *__s;
  Curl_addrinfo *pCVar11;
  Curl_addrinfo *pCVar12;
  char *pcVar13;
  int port;
  char address [64];
  char hostname [256];
  uint local_19c;
  Curl_addrinfo *local_198;
  char *local_190;
  Curl_easy *local_188;
  char *local_180;
  char local_178 [64];
  char local_138 [264];
  
  local_19c = 0;
  pcVar1 = (data->change).resolve;
  do {
    if (pcVar1 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar4 = pcVar1->data;
    if (pcVar4 != (char *)0x0) {
      if (*pcVar4 == '-') {
        iVar3 = __isoc99_sscanf(pcVar4 + 1,"%255[^:]:%d",local_138,&local_19c);
        if (iVar3 == 2) {
          pcVar4 = create_hostcache_id(local_138,local_19c);
          if (pcVar4 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar5 = strlen(pcVar4);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar4,sVar5 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar4);
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar1->data);
        }
      }
      else {
        pcVar6 = strchr(pcVar4,0x3a);
        if ((pcVar6 == (char *)0x0) || (0xff < (long)pcVar6 - (long)pcVar4)) {
LAB_0010b901:
          pCVar11 = (Curl_addrinfo *)0x0;
          pcVar4 = local_190;
        }
        else {
          memcpy(local_138,pcVar4,(long)pcVar6 - (long)pcVar4);
          pcVar6[(long)(local_138 + -(long)pcVar1->data)] = '\0';
          uVar7 = strtoul(pcVar6 + 1,&local_190,10);
          if (0xffff < uVar7) goto LAB_0010b901;
          if (((local_190 == pcVar6 + 1) || (*local_190 != ':')) ||
             (local_19c = (uint)uVar7, *local_190 == '\0')) {
            pCVar11 = (Curl_addrinfo *)0x0;
            pcVar4 = local_190;
          }
          else {
            local_180 = local_190 + 1;
            pCVar11 = (Curl_addrinfo *)0x0;
            pcVar6 = local_190;
            pCVar12 = (Curl_addrinfo *)0x0;
            local_188 = data;
            do {
              __s = pcVar6 + 1;
              local_198 = pCVar11;
              pcVar4 = strchr(__s,0x2c);
              if (pcVar4 == (char *)0x0) {
                sVar5 = strlen(__s);
                pcVar4 = __s + sVar5;
              }
              pcVar13 = pcVar4;
              data = local_188;
              pCVar11 = local_198;
              if (*__s == '[') {
                if ((pcVar4 == __s) || (pcVar4[-1] != ']')) goto LAB_0010b904;
                __s = pcVar6 + 2;
                pcVar13 = pcVar4 + -1;
              }
              uVar7 = (long)pcVar13 - (long)__s;
              pCVar8 = pCVar12;
              if (uVar7 != 0) {
                if (0x3f < uVar7) goto LAB_0010b904;
                memcpy(local_178,__s,uVar7);
                local_178[uVar7] = '\0';
                pCVar8 = Curl_str2addr(local_178,local_19c);
                data = local_188;
                if (pCVar8 == (Curl_addrinfo *)0x0) {
                  local_190 = pcVar4;
                  Curl_infof(local_188,"Resolve address \'%s\' found illegal!\n",local_178);
                  pCVar11 = local_198;
                  pcVar4 = local_190;
                  goto LAB_0010b904;
                }
                pCVar11 = pCVar8;
                if (pCVar12 != (Curl_addrinfo *)0x0) {
                  pCVar12->ai_next = pCVar8;
                  pCVar11 = local_198;
                }
              }
              data = local_188;
              pcVar6 = pcVar4;
              pCVar12 = pCVar8;
            } while (*pcVar4 != '\0');
            if (pCVar11 != (Curl_addrinfo *)0x0) {
              local_190 = pcVar4;
              pcVar4 = create_hostcache_id(local_138,local_19c);
              if (pcVar4 == (char *)0x0) {
LAB_0010bbf3:
                Curl_freeaddrinfo(pCVar11);
                return CURLE_OUT_OF_MEMORY;
              }
              local_198 = pCVar11;
              sVar5 = strlen(pcVar4);
              if (data->share != (Curl_share *)0x0) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pvVar9 = Curl_hash_pick((data->dns).hostcache,pcVar4,sVar5 + 1);
              (*Curl_cfree)(pcVar4);
              pCVar11 = local_198;
              if (pvVar9 == (void *)0x0) {
                pCVar10 = Curl_cache_addr(data,local_198,local_138,local_19c);
                if (pCVar10 == (Curl_dns_entry *)0x0) {
                  bVar2 = true;
                }
                else {
                  pCVar10->timestamp = 0;
                  pCVar10->inuse = pCVar10->inuse + -1;
                  bVar2 = false;
                }
              }
              else {
                bVar2 = false;
                Curl_infof(data,"RESOLVE %s:%d is already cached, %s not stored!\n",local_138,
                           (ulong)local_19c,local_180);
                pCVar11 = local_198;
                Curl_freeaddrinfo(local_198);
              }
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
              if (bVar2) goto LAB_0010bbf3;
              Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_138,(ulong)local_19c,local_180);
              goto LAB_0010b936;
            }
            pCVar11 = (Curl_addrinfo *)0x0;
          }
        }
LAB_0010b904:
        local_190 = pcVar4;
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar1->data);
        Curl_freeaddrinfo(pCVar11);
      }
    }
LAB_0010b936:
    pcVar1 = pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
      char *addresses = NULL;
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
      addresses = end_ptr + 1;

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns) {
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, head, hostname, port);
        if(dns) {
          dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
          /* release the returned reference; the cache itself will keep the
           * entry alive: */
          dns->inuse--;
        }
      }
      else {
        /* this is a duplicate, free it again */
        infof(data, "RESOLVE %s:%d is already cached, %s not stored!\n",
              hostname, port, addresses);
        Curl_freeaddrinfo(head);
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}